

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cpp
# Opt level: O1

int __thiscall ncnn::Interp::forward(Interp *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  uint uVar2;
  int *piVar3;
  size_t sVar4;
  void *pvVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int remain;
  long lVar12;
  uint _h;
  void *pvVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint _c;
  int iVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int iVar24;
  undefined1 auVar23 [16];
  ulong local_60;
  void *local_58;
  
  _c = bottom_blob->w;
  uVar15 = this->output_width;
  _h = this->output_height;
  if (bottom_blob->dims == 1) {
    uVar14 = 1;
    uVar20 = 1;
  }
  else {
    uVar20 = bottom_blob->h;
    uVar14 = _c;
    _c = bottom_blob->c;
  }
  if (uVar15 == 0 || _h == 0) {
    _h = (uint)((float)(int)uVar20 * this->height_scale);
    uVar15 = (uint)((float)(int)uVar14 * this->width_scale);
  }
  if ((_h == uVar20) && (uVar15 == uVar14)) {
    if (top_blob != bottom_blob) {
      piVar3 = bottom_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(*(void **)((long)top_blob->data + -8));
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 8))();
          }
        }
      }
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      top_blob->elemsize = 0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->c = 0;
      top_blob->cstep = 0;
      piVar3 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar3;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->allocator = bottom_blob->allocator;
      iVar16 = bottom_blob->w;
      iVar24 = bottom_blob->h;
      iVar19 = bottom_blob->c;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar16;
      top_blob->h = iVar24;
      top_blob->c = iVar19;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
  }
  else {
    Mat::create(top_blob,uVar15,_h,_c,bottom_blob->elemsize,opt->blob_allocator);
    auVar11 = _DAT_001394c0;
    auVar10 = _DAT_001394b0;
    auVar9 = _DAT_00139440;
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    if (bottom_blob->dims == 1) {
      if (0 < (int)_c) {
        sVar4 = top_blob->cstep;
        uVar15 = top_blob->h * top_blob->w;
        pvVar5 = bottom_blob->data;
        lVar12 = (ulong)uVar15 - 1;
        auVar21._8_4_ = (int)lVar12;
        auVar21._0_8_ = lVar12;
        auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
        lVar12 = (long)top_blob->data + 0xc;
        sVar6 = top_blob->elemsize;
        uVar17 = 0;
        auVar21 = auVar21 ^ _DAT_00139440;
        do {
          if (0 < (int)uVar15) {
            uVar1 = *(undefined4 *)((long)pvVar5 + uVar17 * 4);
            uVar18 = 0;
            do {
              auVar22._8_4_ = (int)uVar18;
              auVar22._0_8_ = uVar18;
              auVar22._12_4_ = (int)(uVar18 >> 0x20);
              auVar23 = (auVar22 | auVar11) ^ auVar9;
              iVar16 = auVar21._4_4_;
              if ((bool)(~(iVar16 < auVar23._4_4_ ||
                          auVar21._0_4_ < auVar23._0_4_ && auVar23._4_4_ == iVar16) & 1)) {
                *(undefined4 *)(lVar12 + -0xc + uVar18 * 4) = uVar1;
              }
              if (auVar23._12_4_ <= auVar21._12_4_ &&
                  (auVar23._8_4_ <= auVar21._8_4_ || auVar23._12_4_ != auVar21._12_4_)) {
                *(undefined4 *)(lVar12 + -8 + uVar18 * 4) = uVar1;
              }
              auVar22 = (auVar22 | auVar10) ^ auVar9;
              iVar24 = auVar22._4_4_;
              if (iVar24 <= iVar16 && (iVar24 != iVar16 || auVar22._0_4_ <= auVar21._0_4_)) {
                *(undefined4 *)(lVar12 + -4 + uVar18 * 4) = uVar1;
                *(undefined4 *)(lVar12 + uVar18 * 4) = uVar1;
              }
              uVar18 = uVar18 + 4;
            } while ((uVar15 + 3 & 0xfffffffc) != uVar18);
          }
          uVar17 = uVar17 + 1;
          lVar12 = lVar12 + sVar4 * sVar6;
        } while (uVar17 != _c);
      }
    }
    else {
      uVar2 = this->resize_type;
      if (uVar2 == 2) {
        resize_bilinear(bottom_blob,top_blob,uVar15,_h,(Allocator *)0x0,1);
        return 0;
      }
      if (uVar2 != 1) {
        fprintf(_stderr,"unsupported resize type %d %d %d\n",(ulong)uVar2,(ulong)_h,(ulong)uVar15);
        return -0xe9;
      }
      if (0 < (int)_c) {
        sVar4 = bottom_blob->cstep;
        sVar6 = bottom_blob->elemsize;
        pvVar5 = bottom_blob->data;
        local_58 = top_blob->data;
        sVar7 = top_blob->cstep;
        sVar8 = top_blob->elemsize;
        local_60 = 0;
        do {
          if (0 < (int)_h) {
            uVar17 = 0;
            pvVar13 = local_58;
            do {
              if (0 < (int)uVar15) {
                iVar16 = (int)((float)(int)uVar17 / this->height_scale);
                if ((int)(uVar20 - 1) < iVar16) {
                  iVar16 = uVar20 - 1;
                }
                uVar18 = 0;
                do {
                  iVar19 = (int)((float)(int)uVar18 / this->width_scale);
                  iVar24 = uVar14 - 1;
                  if (iVar19 <= (int)(uVar14 - 1)) {
                    iVar24 = iVar19;
                  }
                  *(undefined4 *)((long)pvVar13 + uVar18 * 4) =
                       *(undefined4 *)
                        ((long)pvVar5 +
                        (long)(int)(iVar24 + iVar16 * uVar14) * 4 + sVar4 * sVar6 * local_60);
                  uVar18 = uVar18 + 1;
                } while (uVar15 != uVar18);
              }
              uVar17 = uVar17 + 1;
              pvVar13 = (void *)((long)pvVar13 + (ulong)uVar15 * 4);
            } while (uVar17 != _h);
          }
          local_60 = local_60 + 1;
          local_58 = (void *)((long)local_58 + sVar7 * sVar8);
        } while (local_60 != _c);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Interp::forward(const Mat &bottom_blob, Mat &top_blob, const Option& opt) const
{
    int h = bottom_blob.h;
    int w = bottom_blob.w;
    int c = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int oh = output_height;
    int ow = output_width;
    if (bottom_blob.dims == 1)
    {
        h = 1;
        w = 1;
        c = bottom_blob.w;
    }
    if (oh == 0 || ow == 0)
    {
        oh = h * height_scale;
        ow = w * width_scale;
    }
    if (oh == h && ow == w)
    {
        top_blob = bottom_blob;
        return 0;
    }
    top_blob.create(ow, oh, c, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (bottom_blob.dims == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat top_blob_c = top_blob.channel(q);
            const float *ptr = ((const float*)bottom_blob.data + q);
            top_blob_c.fill(*ptr);
        }
        return 0;
    }

    if (resize_type == 1)//nearest
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float *ptr = bottom_blob.channel(q);
            float *output_ptr = top_blob.channel(q);
            for (int y = 0; y < oh; ++y)
            {
                const int in_y = std::min((int) (y / height_scale), (h - 1));
                for (int x = 0; x < ow; ++x)
                {
                    const int in_x = std::min((int) (x / width_scale), (w - 1));
                    output_ptr[ow * y + x] = ptr[in_y * w + in_x];
                }
            }
        }
        return 0;

    }
    else if (resize_type == 2)// bilinear
    {
        resize_bilinear(bottom_blob, top_blob, ow, oh);
        return 0;

    }
    else
    {
        fprintf(stderr, "unsupported resize type %d %d %d\n", resize_type, oh, ow);
        return -233;
    }
}